

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void __thiscall cs::statement_while::run_impl(statement_while *this)

{
  bool bVar1;
  element_type *peVar2;
  bool *pbVar3;
  long in_RDI;
  exception *e;
  exception *e_1;
  statement_base **ptr;
  iterator __end2;
  iterator __begin2;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range2;
  scope_guard scope;
  undefined1 in_stack_000007ef;
  iterator *in_stack_000007f0;
  runtime_type *in_stack_000007f8;
  _Self *in_stack_fffffffffffffea8;
  process_context *in_stack_fffffffffffffeb0;
  any *in_stack_ffffffffffffff30;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**> local_58;
  long local_38;
  tree_node *local_20;
  
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1de275);
  peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1de281);
  if ((peVar2->break_block & 1U) != 0) {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1de298);
    peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1de2a4);
    peVar2->break_block = false;
  }
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1de2b9);
  peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1de2c5);
  if ((peVar2->continue_block & 1U) != 0) {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1de2dc);
    peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1de2e8);
    peVar2->continue_block = false;
  }
  scope_guard::scope_guard
            ((scope_guard *)in_stack_fffffffffffffeb0,(context_t *)in_stack_fffffffffffffea8);
  do {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1de313);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1de31f);
    local_20 = (tree_node *)
               tree_type<cs::token_base_*>::root
                         ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffea8);
    runtime_type::parse_expr(in_stack_000007f8,in_stack_000007f0,(bool)in_stack_000007ef);
    pbVar3 = cs_impl::any::const_val<bool>(in_stack_ffffffffffffff30);
    bVar1 = *pbVar3;
    cs_impl::any::~any((any *)0x1de390);
    if ((bVar1 & 1U) == 0) {
LAB_001de7d4:
      scope_guard::~scope_guard((scope_guard *)0x1de7e1);
      return;
    }
    process_context::poll_event(in_stack_fffffffffffffeb0);
    local_38 = in_RDI + 0x28;
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffea8);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffea8);
    while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8),
          bVar1) {
      std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
      operator*(&local_58);
      statement_base::run((statement_base *)in_stack_fffffffffffffeb0);
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1de6ee);
      peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1de6fa);
      if ((peVar2->return_fcall & 1U) != 0) goto LAB_001de7d4;
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1de71e);
      peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1de72a);
      if ((peVar2->break_block & 1U) != 0) {
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1de741);
        peVar2 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1de74d);
        peVar2->break_block = false;
        goto LAB_001de7d4;
      }
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1de76c);
      peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1de778);
      if ((peVar2->continue_block & 1U) != 0) {
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1de78f);
        peVar2 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1de79b);
        peVar2->continue_block = false;
        break;
      }
      std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
      operator++((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                  *)in_stack_fffffffffffffeb0);
    }
    scope_guard::clear((scope_guard *)0x1de7c5);
  } while( true );
}

Assistant:

void statement_while::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		while (context->instance->parse_expr(mTree.root()).const_val<boolean>()) {
			current_process->poll_event();
			for (auto &ptr: mBlock) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}